

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O3

bool double_conversion::IsHexFloatString<char_const*>
               (char *start,char *end,uc16 separator,bool allow_trailing_junk)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  long lVar6;
  byte *local_48;
  char *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,allow_trailing_junk);
  bVar2 = false;
  local_48 = (byte *)start;
  local_40 = end;
  do {
    uVar4 = (uint)(char)*local_48;
    if (0x3f < (int)uVar4 || 9 < uVar4 - 0x30) {
      uVar5 = *local_48 - 0x2e;
      if (0x38 < uVar5) goto LAB_004eb49f;
      if ((0x1f8000001f80000U >> ((ulong)uVar5 & 0x3f) & 1) == 0) {
        if ((ulong)uVar5 == 0) {
          bVar1 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
          if (bVar1) {
            return false;
          }
          while( true ) {
            uVar4 = (uint)(char)*local_48;
            if ((0x3f < (int)uVar4 || 9 < uVar4 - 0x30) &&
               ((uVar5 = *local_48 - 0x41, 0x25 < uVar5 ||
                ((0x3f0000003fU >> ((ulong)uVar5 & 0x3f) & 1) == 0)))) break;
            bVar1 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
            bVar2 = true;
            if (bVar1) {
              return false;
            }
          }
        }
LAB_004eb49f:
        if (!bVar2) {
          return false;
        }
        if ((uVar4 & 0xff | 0x20) != 0x70) {
          return false;
        }
        bVar2 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
        if (bVar2) {
          return false;
        }
        bVar3 = *local_48;
        if ((bVar3 == 0x2d) || (bVar3 == 0x2b)) {
          bVar2 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
          if (bVar2) {
            return false;
          }
          bVar3 = *local_48;
        }
        if ((char)bVar3 < ':') {
          if (9 < (int)(char)bVar3 - 0x30U) {
            return false;
          }
          bVar2 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
          if (!bVar2) {
            while (((char)*local_48 < 0x3a && ((int)(char)*local_48 - 0x30U < 10))) {
              bVar2 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
              if (bVar2) {
                return true;
              }
            }
            if (local_48 != (byte *)end && (char)local_34 == '\0') {
              do {
                lVar6 = 0;
                while ((&kWhitespaceTable7)[lVar6] != *local_48) {
                  lVar6 = lVar6 + 1;
                  if (lVar6 == 6) {
                    return false;
                  }
                }
                local_48 = local_48 + 1;
              } while (local_48 != (byte *)end);
            }
          }
          return true;
        }
        return false;
      }
    }
    bVar1 = Advance<char_const*>((char **)&local_48,separator,0x10,&local_40);
    bVar2 = true;
    if (bVar1) {
      return false;
    }
  } while( true );
}

Assistant:

static bool IsHexFloatString(Iterator start,
                             Iterator end,
                             uc16 separator,
                             bool allow_trailing_junk) {
  DOUBLE_CONVERSION_ASSERT(start != end);

  Iterator current = start;

  bool saw_digit = false;
  while (isDigit(*current, 16)) {
    saw_digit = true;
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (*current == '.') {
    if (Advance(&current, separator, 16, end)) return false;
    while (isDigit(*current, 16)) {
      saw_digit = true;
      if (Advance(&current, separator, 16, end)) return false;
    }
  }
  if (!saw_digit) return false;
  if (*current != 'p' && *current != 'P') return false;
  if (Advance(&current, separator, 16, end)) return false;
  if (*current == '+' || *current == '-') {
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (!isDigit(*current, 10)) return false;
  if (Advance(&current, separator, 16, end)) return true;
  while (isDigit(*current, 10)) {
    if (Advance(&current, separator, 16, end)) return true;
  }
  return allow_trailing_junk || !AdvanceToNonspace(&current, end);
}